

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

char * ma_dr_flac_next_vorbis_comment
                 (ma_dr_flac_vorbis_comment_iterator *pIter,ma_uint32 *pCommentLengthOut)

{
  ma_uint32 mVar1;
  ma_uint32 *pmVar2;
  ma_uint32 *pmVar3;
  
  if (pCommentLengthOut != (ma_uint32 *)0x0) {
    *pCommentLengthOut = 0;
  }
  if (((pIter == (ma_dr_flac_vorbis_comment_iterator *)0x0) || (pIter->countRemaining == 0)) ||
     (pmVar2 = (ma_uint32 *)pIter->pRunningData, pmVar2 == (ma_uint32 *)0x0)) {
    pmVar3 = (ma_uint32 *)0x0;
  }
  else {
    pmVar3 = pmVar2 + 1;
    mVar1 = *pmVar2;
    pIter->pRunningData = (char *)((long)pmVar2 + (long)(int)mVar1 + 4);
    pIter->countRemaining = pIter->countRemaining - 1;
    if (pCommentLengthOut != (ma_uint32 *)0x0) {
      *pCommentLengthOut = mVar1;
      return (char *)pmVar3;
    }
  }
  return (char *)pmVar3;
}

Assistant:

MA_API const char* ma_dr_flac_next_vorbis_comment(ma_dr_flac_vorbis_comment_iterator* pIter, ma_uint32* pCommentLengthOut)
{
    ma_int32 length;
    const char* pComment;
    if (pCommentLengthOut) {
        *pCommentLengthOut = 0;
    }
    if (pIter == NULL || pIter->countRemaining == 0 || pIter->pRunningData == NULL) {
        return NULL;
    }
    length = ma_dr_flac__le2host_32_ptr_unaligned(pIter->pRunningData);
    pIter->pRunningData += 4;
    pComment = pIter->pRunningData;
    pIter->pRunningData += length;
    pIter->countRemaining -= 1;
    if (pCommentLengthOut) {
        *pCommentLengthOut = length;
    }
    return pComment;
}